

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  ArrayIndex AVar1;
  ArrayIndex AVar2;
  Value *pVVar3;
  ArrayIndex index;
  ArrayIndex index_00;
  uint uVar4;
  StyledStreamWriter *this_00;
  byte bVar5;
  bool bVar6;
  long lVar7;
  ArrayIndex index_1;
  ulong uVar8;
  bool bVar9;
  
  AVar1 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  index_00 = 0;
  do {
    if ((AVar1 <= index_00) || (bVar9)) {
      bVar6 = true;
      if (!bVar9) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar1);
        this->field_0x68 = this->field_0x68 | 1;
        uVar4 = AVar1 * 2 + 2;
        lVar7 = 8;
        bVar5 = 0;
        for (uVar8 = 0; AVar1 != uVar8; uVar8 = uVar8 + 1) {
          this_00 = (StyledStreamWriter *)value;
          pVVar3 = Value::operator[](value,(ArrayIndex)uVar8);
          bVar9 = hasCommentForValue(this_00,pVVar3);
          bVar5 = bVar5 | bVar9;
          pVVar3 = Value::operator[](value,(ArrayIndex)uVar8);
          writeValue(this,pVVar3);
          uVar4 = uVar4 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar7);
          lVar7 = lVar7 + 0x20;
        }
        this->field_0x68 = this->field_0x68 & 0xfe;
        bVar6 = (bool)(bVar5 | this->rightMargin_ <= uVar4);
      }
      return bVar6;
    }
    pVVar3 = Value::operator[](value,index_00);
    bVar9 = Value::isArray(pVVar3);
    if (bVar9) {
LAB_00423277:
      AVar2 = Value::size(pVVar3);
      bVar9 = AVar2 != 0;
    }
    else {
      bVar9 = Value::isObject(pVVar3);
      if (bVar9) goto LAB_00423277;
      bVar9 = false;
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}